

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.hpp
# Opt level: O3

NodeChildren * __thiscall
duckdb::Node256::ExtractChildren
          (NodeChildren *__return_storage_ptr__,Node256 *this,ArenaAllocator *arena)

{
  data_ptr_t ptr_p;
  Node *pNVar1;
  uchar *puVar2;
  idx_t i;
  long lVar3;
  ushort uVar4;
  array_ptr<duckdb::Node,_true> children_ptr;
  array_ptr<unsigned_char,_true> bytes;
  array_ptr<duckdb::Node,_true> local_50;
  array_ptr<unsigned_char,_true> local_40;
  
  ptr_p = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  array_ptr<unsigned_char,_true>::array_ptr(&local_40,ptr_p,(ulong)this->count);
  pNVar1 = (Node *)ArenaAllocator::AllocateAligned(arena,(ulong)this->count << 3);
  array_ptr<duckdb::Node,_true>::array_ptr(&local_50,pNVar1,(ulong)this->count);
  uVar4 = 0;
  lVar3 = 0;
  do {
    if (*(char *)((long)&this->children[lVar3].super_IndexPointer.data + 7) != '\0') {
      puVar2 = array_ptr<unsigned_char,_true>::operator[](&local_40,(ulong)uVar4);
      *puVar2 = (uchar)lVar3;
      pNVar1 = array_ptr<duckdb::Node,_true>::operator[](&local_50,(ulong)uVar4);
      (pNVar1->super_IndexPointer).data = this->children[lVar3].super_IndexPointer.data;
      uVar4 = uVar4 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  this->count = 0;
  (__return_storage_ptr__->bytes).ptr = local_40.ptr;
  (__return_storage_ptr__->bytes).count = local_40.count;
  (__return_storage_ptr__->children).ptr = local_50.ptr;
  (__return_storage_ptr__->children).count = local_50.count;
  return __return_storage_ptr__;
}

Assistant:

NodeChildren ExtractChildren(ArenaAllocator &arena) {
		auto mem_bytes = arena.AllocateAligned(sizeof(uint8_t) * count);
		array_ptr<uint8_t> bytes(mem_bytes, count);
		auto mem_children = arena.AllocateAligned(sizeof(Node) * count);
		array_ptr<Node> children_ptr(reinterpret_cast<Node *>(mem_children), count);

		uint16_t ptr_idx = 0;
		for (idx_t i = 0; i < CAPACITY; i++) {
			if (children[i].HasMetadata()) {
				bytes[ptr_idx] = UnsafeNumericCast<uint8_t>(i);
				children_ptr[ptr_idx] = children[i];
				ptr_idx++;
			}
		}

		count = 0;
		return NodeChildren(bytes, children_ptr);
	}